

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O3

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::List,_(ritobin::Category)6>::from_json
          (ErrorStackOption *__return_storage_ptr__,List *value,json *json)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  const_iterator cVar5;
  const_reference pvVar6;
  reference json_00;
  reference value_00;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  _Rb_tree_header *type;
  size_t index;
  ulong uVar9;
  undefined8 uVar10;
  json_impl *this;
  string_view type_name;
  string valueType_name;
  const_iterator __end3;
  const_iterator __begin3;
  string local_140;
  undefined1 local_120 [72];
  vector<ritobin::Element,std::allocator<ritobin::Element>> *local_d8;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_70;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  if (json->m_type == object) {
    cVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
            ::_M_find_tr<char[10],void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                        *)(json->m_value).object,(char (*) [10])"valueType");
    if (cVar5._M_node ==
        (_Base_ptr)
        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
          *)(json->m_value).object + 8)) {
      (__return_storage_ptr__->
      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
      super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
           "list";
      pcVar7 = "json.contains(\"valueType\")";
    }
    else {
      if (json->m_type == object) {
        cVar5 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                ::_M_find_tr<char[6],void>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                            *)(json->m_value).object,(char (*) [6])"items");
        type = &(((json->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)cVar5._M_node != type) {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)json,"valueType");
          if (pvVar6->m_type == string) {
            pvVar6 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)json,"items");
            if (pvVar6->m_type == array) {
              pvVar6 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                   *)json,"valueType");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_90,pvVar6);
              type_name._M_str = (char *)value;
              type_name._M_len = (size_t)local_90._M_dataplus._M_p;
              bVar4 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                      ::try_type_name_to_type
                                ((ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                                  *)local_90._M_string_length,type_name,(Type *)type);
              if (bVar4) {
                pvVar6 = nlohmann::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                     *)json,"items");
                local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
                local_50.m_it.array_iterator._M_current =
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)0x0;
                local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
                local_50.m_object = pvVar6;
                nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::set_begin(&local_50);
                local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
                local_70.m_it.array_iterator._M_current =
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)0x0;
                local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
                local_70.m_object = pvVar6;
                nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::set_end(&local_70);
                local_d8 = (vector<ritobin::Element,std::allocator<ritobin::Element>> *)
                           &value->items;
                this = (json_impl *)0x0;
                while (bVar4 = nlohmann::detail::
                               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator==(&local_50,&local_70), !bVar4) {
                  json_00 = nlohmann::detail::
                            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::operator*(&local_50);
                  ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                  ::type_to_value((Value *)local_120,value->valueType);
                  value_00 = std::vector<ritobin::Element,std::allocator<ritobin::Element>>::
                             emplace_back<std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>
                                       (local_d8,(Value *)local_120);
                  std::__detail::__variant::
                  _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                  ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                       *)local_120);
                  item_from_json(__return_storage_ptr__,value_00,json_00);
                  if ((__return_storage_ptr__->
                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                      _M_payload.
                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                      .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged
                      == true) {
                    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"items","");
                    to_index((string *)local_120,&local_b0);
                    to_index_abi_cxx11_(&local_d0,this,index);
                    uVar2 = local_d0._M_string_length + CONCAT17(local_120[0xf],local_120._8_7_);
                    uVar9 = 0xf;
                    if ((char *)CONCAT17(local_120[7],local_120._0_7_) != local_120 + 0x10) {
                      uVar9 = local_120._16_8_;
                    }
                    if (uVar9 < uVar2) {
                      uVar10 = 0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                        uVar10 = local_d0.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar10 < uVar2) goto LAB_00128015;
                      pbVar8 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               replace(&local_d0,0,0,(char *)CONCAT17(local_120[7],local_120._0_7_),
                                       CONCAT17(local_120[0xf],local_120._8_7_));
                    }
                    else {
LAB_00128015:
                      pbVar8 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_120,local_d0._M_dataplus._M_p,
                                         local_d0._M_string_length);
                    }
                    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(pbVar8->_M_dataplus)._M_p;
                    paVar1 = &pbVar8->field_2;
                    if (paVar3 == paVar1) {
                      local_140.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                      local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                    }
                    else {
                      local_140.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                      local_140._M_dataplus._M_p = (pointer)paVar3;
                    }
                    local_140._M_string_length = pbVar8->_M_string_length;
                    (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
                    pbVar8->_M_string_length = 0;
                    paVar1->_M_local_buf[0] = '\0';
                    ErrorStack::push((ErrorStack *)__return_storage_ptr__,&local_140);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                      operator_delete(local_140._M_dataplus._M_p,
                                      local_140.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                      operator_delete(local_d0._M_dataplus._M_p,
                                      local_d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((char *)CONCAT17(local_120[7],local_120._0_7_) != local_120 + 0x10) {
                      operator_delete((char *)CONCAT17(local_120[7],local_120._0_7_),
                                      local_120._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      local_b0.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_001280ee;
                  }
                  this = this + 1;
                  nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator++(&local_50);
                }
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
              }
              else {
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value
                .type = "list";
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value
                .message = "ValueHelper::try_type_name_to_type(valueType_name, value.valueType)";
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value
                .path._M_dataplus._M_p =
                     (pointer)((long)&(__return_storage_ptr__->
                                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                                      )._M_payload.
                                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>
                                      ._M_payload + 0x20);
                *(undefined1 *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                         _M_payload.
                         super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                         .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                         _M_payload + 0x20) = 0;
                *(ulong *)((long)&(__return_storage_ptr__->
                                  super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                                  .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                                  _M_payload._M_value.path.field_2 + 1) =
                     CONCAT17(local_120[7],local_120._0_7_);
                *(ulong *)((long)&(__return_storage_ptr__->
                                  super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                                  .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                                  _M_payload._M_value.path.field_2 + 8) =
                     CONCAT71(local_120._8_7_,local_120[7]);
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value
                .path._M_string_length = 0;
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
              }
LAB_001280ee:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p == &local_90.field_2) {
                return __return_storage_ptr__;
              }
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
              return __return_storage_ptr__;
            }
            (__return_storage_ptr__->
            super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
            super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
            super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.
            type = "list";
            pcVar7 = "json[\"items\"].is_array()";
          }
          else {
            (__return_storage_ptr__->
            super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
            super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
            super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.
            type = "list";
            pcVar7 = "json[\"valueType\"].is_string()";
          }
          goto LAB_00127eec;
        }
      }
      (__return_storage_ptr__->
      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
      super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
           "list";
      pcVar7 = "json.contains(\"items\")";
    }
  }
  else {
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
         "list";
    pcVar7 = "json.is_object()";
  }
LAB_00127eec:
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.message =
       pcVar7;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_dataplus._M_p =
       (pointer)((long)&(__return_storage_ptr__->
                        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                        _M_payload.
                        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                        .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload
                + 0x20);
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x20) = 0;
  *(ulong *)((long)&(__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                    _M_value.path.field_2 + 1) = CONCAT17(local_120[7],local_120._0_7_);
  *(ulong *)((long)&(__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                    _M_value.path.field_2 + 8) = CONCAT71(local_120._8_7_,local_120[7]);
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_string_length = 0;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_object());
            bin_json_assert(json.contains("valueType"));
            bin_json_assert(json.contains("items"));
            bin_json_assert(json["valueType"].is_string());
            bin_json_assert(json["items"].is_array());
            std::string valueType_name = json["valueType"];
            bin_json_assert(ValueHelper::try_type_name_to_type(valueType_name, value.valueType));
            auto const& json_items = json["items"];
            size_t index = 0;
            for (auto const& json_item: json_items) {
                auto& value_item = value.items.emplace_back(ValueHelper::type_to_value(value.valueType));
                bin_json_rethrow(to_index("items") + to_index(index),
                                 item_from_json(value_item, json_item));
                ++index;
            }
            return std::nullopt;
        }